

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O0

void __thiscall FTagManager::AddLineID(FTagManager *this,int line,int tag)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  uint *puVar4;
  FTagItem *pFVar5;
  undefined1 local_2c [8];
  FTagItem it;
  uint i;
  int tag_local;
  int line_local;
  FTagManager *this_local;
  
  if (tag != -1) {
    while (uVar2 = TArray<int,_int>::Size(&this->startForLine), uVar2 <= (uint)line) {
      it.nexttag = -1;
      TArray<int,_int>::Push(&this->startForLine,&it.nexttag);
    }
    piVar3 = TArray<int,_int>::operator[](&this->startForLine,(long)line);
    if (*piVar3 == -1) {
      uVar2 = TArray<FTagItem,_FTagItem>::Size(&this->allIDs);
      puVar4 = (uint *)TArray<int,_int>::operator[](&this->startForLine,(long)line);
      *puVar4 = uVar2;
    }
    else {
      piVar3 = TArray<int,_int>::operator[](&this->startForLine,(long)line);
      for (it.tag = *piVar3; iVar1 = it.tag, uVar2 = TArray<FTagItem,_FTagItem>::Size(&this->allIDs)
          , (uint)iVar1 < uVar2; it.tag = it.tag + 1) {
        pFVar5 = TArray<FTagItem,_FTagItem>::operator[](&this->allIDs,(ulong)(uint)it.tag);
        if (pFVar5->tag == tag) {
          return;
        }
      }
    }
    it.target = -1;
    local_2c._0_4_ = line;
    local_2c._4_4_ = tag;
    TArray<FTagItem,_FTagItem>::Push(&this->allIDs,(FTagItem *)local_2c);
  }
  return;
}

Assistant:

void FTagManager::AddLineID(int line, int tag)
{
	if (tag == -1) return;	// For line IDs -1 means 'not set', unlike sectors.

	// This function assumes that all ids for a single line get added sequentially.
	while (startForLine.Size() <= (unsigned int)line)
	{
		startForLine.Push(-1);
	}
	if (startForLine[line] == -1)
	{
		startForLine[line] = allIDs.Size();
	}
	else
	{
		// check if the key was already defined
		for (unsigned i = startForLine[line]; i < allIDs.Size(); i++)
		{
			if (allIDs[i].tag == tag)
			{
				return;
			}
		}
	}
	FTagItem it = { line, tag, -1 };
	allIDs.Push(it);
}